

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

void __thiscall QPanGesture::QPanGesture(QPanGesture *this,QObject *parent)

{
  QPanGesturePrivate *this_00;
  
  this_00 = (QPanGesturePrivate *)operator_new(0xf0);
  QPanGesturePrivate::QPanGesturePrivate(this_00);
  QGesture::QGesture(&this->super_QGesture,(QGesturePrivate *)this_00,parent);
  *(undefined ***)&this->super_QGesture = &PTR_metaObject_007bfe90;
  *(undefined4 *)(*(long *)&(this->super_QGesture).field_0x8 + 0x78) = 3;
  return;
}

Assistant:

QPanGesture::QPanGesture(QObject *parent)
    : QGesture(*new QPanGesturePrivate, parent)
{
    d_func()->gestureType = Qt::PanGesture;
}